

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O3

AppStatePtr __thiscall
anon_unknown.dwarf_67a2b::StateBlockBuilder::getNextState(StateBlockBuilder *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  AppStatePtr AVar2;
  AppStatePtr AVar3;
  
  in_RDI->_vptr_AppState =
       (_func_int **)
       (this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->m_completed = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      AVar2.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      AVar2.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (AppStatePtr)AVar2.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  AVar3.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  AVar3.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (AppStatePtr)AVar3.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual AppStatePtr getNextState() override { return m_nextState; }